

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.cxx
# Opt level: O3

void __thiscall Fl_Choice::draw(Fl_Choice *this)

{
  Fl_Menu_Item *pFVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Color FVar5;
  Fl_Color c;
  _func_int **pp_Var6;
  uint uVar7;
  uint uVar8;
  Fl_Boxtype t;
  int H;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int W;
  uint uVar13;
  int iVar14;
  Fl_Menu_Item m;
  Fl_Menu_Item local_98;
  Fl_Label local_60;
  
  t = (Fl::scheme_ == (char *)0x0) + FL_UP_BOX;
  iVar2 = Fl::box_dx(t);
  iVar3 = Fl::box_dy(t);
  __s2 = Fl::scheme_;
  H = (this->super_Fl_Menu_).super_Fl_Widget.h_ + iVar3 * -2;
  if (Fl::scheme_ == (char *)0x0) {
LAB_001a9f45:
    W = 0x14;
    if (H < 0x14) {
      W = H;
    }
  }
  else {
    iVar4 = strcmp("gtk+",Fl::scheme_);
    W = 0x14;
    if ((iVar4 != 0) && (iVar4 = strcmp("gleam",__s2), iVar4 != 0)) {
      strcmp("plastic",__s2);
      goto LAB_001a9f45;
    }
  }
  iVar14 = ((this->super_Fl_Menu_).super_Fl_Widget.x_ - (iVar2 + W)) +
           (this->super_Fl_Menu_).super_Fl_Widget.w_;
  iVar4 = (this->super_Fl_Menu_).super_Fl_Widget.y_ + iVar3;
  uVar7 = (W + -4) / 3;
  uVar8 = 1;
  if (1 < (int)uVar7) {
    uVar8 = uVar7;
  }
  uVar7 = uVar8 * 2;
  uVar13 = (int)(~uVar7 + W) / 2 + iVar14;
  uVar9 = (int)(~uVar8 + H) / 2 + iVar4;
  if (__s2 == (char *)0x0) {
    c = 7;
    FVar5 = fl_contrast((this->super_Fl_Menu_).textcolor_,7);
    if (FVar5 != (this->super_Fl_Menu_).textcolor_) {
      c = fl_color_average((this->super_Fl_Menu_).super_Fl_Widget.color_,0xff,0.67);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,t,c);
    Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,iVar14,iVar4,W,H,
                        (this->super_Fl_Menu_).super_Fl_Widget.color_);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar5 = (this->super_Fl_Menu_).super_Fl_Widget.label_.color;
    if (iVar4 == 0) {
      FVar5 = fl_inactive(FVar5);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    uVar10 = uVar8 + uVar9;
    pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
LAB_001aa289:
    (*pp_Var6[0x16])(fl_graphics_driver,(ulong)uVar13,(ulong)uVar9,(ulong)(uVar13 + uVar8),
                     (ulong)uVar10,(ulong)(uVar7 + uVar13),uVar9);
  }
  else {
    Fl_Widget::draw_box((Fl_Widget *)this,t,(this->super_Fl_Menu_).super_Fl_Widget.color_);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar5 = (this->super_Fl_Menu_).super_Fl_Widget.label_.color;
    if (iVar4 == 0) {
      FVar5 = fl_inactive(FVar5);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    if ((Fl::scheme_ != (char *)0x0) && (iVar4 = strcmp("plastic",Fl::scheme_), iVar4 == 0)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)uVar13,(ulong)(uVar9 + 3),(ulong)(uVar13 + uVar8),
                 (ulong)(uVar8 + uVar9 + 3),(ulong)(uVar7 + uVar13),uVar9 + 3);
      uVar10 = (uVar9 - uVar8) + 1;
      pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar9 = uVar9 + 1;
      goto LAB_001aa289;
    }
    iVar4 = (this->super_Fl_Menu_).super_Fl_Widget.w_;
    iVar14 = (this->super_Fl_Menu_).super_Fl_Widget.y_;
    iVar12 = (this->super_Fl_Menu_).super_Fl_Widget.x_ - iVar2;
    uVar8 = (iVar4 + iVar12) - 0xd;
    iVar11 = (this->super_Fl_Menu_).super_Fl_Widget.h_ / 2;
    uVar7 = (iVar11 + iVar14) - 2;
    uVar9 = iVar12 + -10 + iVar4;
    uVar13 = iVar12 + -7 + iVar4;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,(ulong)uVar8,(ulong)uVar7,(ulong)uVar9,
               (ulong)(uint)(iVar11 + -5 + iVar14),(ulong)uVar13,uVar7);
    uVar7 = iVar11 + iVar14 + 2;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,(ulong)uVar8,(ulong)uVar7,(ulong)uVar9,
               (ulong)(uint)(iVar11 + 5 + iVar14),(ulong)uVar13,uVar7);
    FVar5 = fl_color_average((this->super_Fl_Menu_).super_Fl_Widget.color_,0x38,0.67);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    uVar7 = iVar11 + -8 + iVar14;
    uVar8 = iVar11 + 8 + iVar14;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,(ulong)((iVar4 + iVar12) - 0x14),(ulong)uVar7,(ulong)uVar8);
    FVar5 = fl_color_average((this->super_Fl_Menu_).super_Fl_Widget.color_,0xff,0.67);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,(ulong)((iVar4 + iVar12) - 0x13),(ulong)uVar7,(ulong)uVar8);
  }
  pFVar1 = (this->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) goto LAB_001aa460;
  local_98.labelcolor_ = pFVar1->labelcolor_;
  local_98._52_4_ = *(undefined4 *)&pFVar1->field_0x34;
  local_98.text = pFVar1->text;
  local_98.shortcut_ = pFVar1->shortcut_;
  local_98._12_4_ = *(undefined4 *)&pFVar1->field_0xc;
  local_98.callback_ = pFVar1->callback_;
  local_98.user_data_ = pFVar1->user_data_;
  local_98.flags = pFVar1->flags;
  local_98.labeltype_ = pFVar1->labeltype_;
  local_98._37_3_ = *(undefined3 *)&pFVar1->field_0x25;
  local_98.labelfont_ = pFVar1->labelfont_;
  local_98.labelsize_ = pFVar1->labelsize_;
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  local_98.flags = (uint)(iVar4 == 0) | local_98.flags & 0xfffffffeU;
  uVar9 = (this->super_Fl_Menu_).super_Fl_Widget.x_ + iVar2;
  uVar7 = iVar3 + (this->super_Fl_Menu_).super_Fl_Widget.y_ + 1;
  uVar13 = (this->super_Fl_Menu_).super_Fl_Widget.w_ - (W + iVar2 * 2);
  uVar8 = H - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)uVar9,(ulong)uVar7,(ulong)uVar13,(ulong)uVar8);
  if (Fl::scheme_ == (char *)0x0) {
    fl_draw_shortcut = '\x02';
    Fl_Menu_Item::draw(&local_98,uVar9,uVar7,uVar13,uVar8,&this->super_Fl_Menu_,
                       (uint)(Fl::focus_ == (Fl_Widget *)this));
    fl_draw_shortcut = '\0';
  }
  else {
    local_60.value = local_98.text;
    local_60.image = (Fl_Image *)0x0;
    local_60.deimage = (Fl_Image *)0x0;
    local_60.type = local_98.labeltype_;
    if (local_98.labelsize_ == 0 && local_98.labelfont_ == 0) {
      local_60.font = (this->super_Fl_Menu_).textfont_;
LAB_001aa3c2:
      local_60.size = (this->super_Fl_Menu_).textsize_;
    }
    else {
      local_60.font = local_98.labelfont_;
      local_60.size = local_98.labelsize_;
      if (local_98.labelsize_ == 0) goto LAB_001aa3c2;
    }
    local_60.color = local_98.labelcolor_;
    if (local_98.labelcolor_ == 0) {
      local_60.color = (this->super_Fl_Menu_).textcolor_;
    }
    if (iVar4 == 0) {
      local_60.color = fl_inactive(local_60.color);
    }
    fl_draw_shortcut = '\x02';
    iVar2 = 0;
    if (6 < (int)uVar13) {
      iVar2 = uVar13 - 6;
    }
    Fl_Label::draw(&local_60,uVar9 + 3,uVar7,iVar2,uVar8,4);
    fl_draw_shortcut = '\0';
    if (Fl::focus_ == (Fl_Widget *)this) {
      Fl_Widget::draw_focus
                ((Fl_Widget *)this,(uint)(this->super_Fl_Menu_).super_Fl_Widget.box_,uVar9,uVar7,
                 uVar13,uVar8);
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
LAB_001aa460:
  Fl_Widget::draw_label((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Choice::draw() {
  Fl_Boxtype btype = Fl::scheme() ? FL_UP_BOX		// non-default uses up box
                                  : FL_DOWN_BOX;	// default scheme uses down box
  int dx = Fl::box_dx(btype);
  int dy = Fl::box_dy(btype);

  // Arrow area
  int H = h() - 2 * dy;
  int W = Fl::is_scheme("gtk+")    ? 20 :			// gtk+  -- fixed size
          Fl::is_scheme("gleam")   ? 20 :			// gleam -- fixed size
          Fl::is_scheme("plastic") ? ((H > 20) ? 20 : H)	// plastic: shrink if H<20
                                   : ((H > 20) ? 20 : H);	// default: shrink if H<20
  int X = x() + w() - W - dx;
  int Y = y() + dy;

  // Arrow object
  int w1 = (W - 4) / 3; if (w1 < 1) w1 = 1;
  int x1 = X + (W - 2 * w1 - 1) / 2;
  int y1 = Y + (H - w1 - 1) / 2;

  if (Fl::scheme()) {
    // NON-DEFAULT SCHEME

    // Draw widget box
    draw_box(btype, color());

    // Draw arrow area
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    if (Fl::is_scheme("plastic")) {
      // Show larger up/down arrows...
      fl_polygon(x1, y1 + 3, x1 + w1, y1 + w1 + 3, x1 + 2 * w1, y1 + 3);
      fl_polygon(x1, y1 + 1, x1 + w1, y1 - w1 + 1, x1 + 2 * w1, y1 + 1);
    } else {
      // Show smaller up/down arrows with a divider...
      x1 = x() + w() - 13 - dx;
      y1 = y() + h() / 2;
      fl_polygon(x1, y1 - 2, x1 + 3, y1 - 5, x1 + 6, y1 - 2);
      fl_polygon(x1, y1 + 2, x1 + 3, y1 + 5, x1 + 6, y1 + 2);

      fl_color(fl_darker(color()));
      fl_yxline(x1 - 7, y1 - 8, y1 + 8);

      fl_color(fl_lighter(color()));
      fl_yxline(x1 - 6, y1 - 8, y1 + 8);
    }
  } else {
    // DEFAULT SCHEME

    // Draw widget box
    if (fl_contrast(textcolor(), FL_BACKGROUND2_COLOR) == textcolor()) {
      draw_box(btype, FL_BACKGROUND2_COLOR);
    } else {
      draw_box(btype, fl_lighter(color()));
    }

    // Draw arrow area
    draw_box(FL_UP_BOX,X,Y,W,H,color());
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    fl_polygon(x1, y1, x1 + w1, y1 + w1, x1 + 2 * w1, y1);
  }

  W += 2 * dx;

  // Draw menu item's label
  if (mvalue()) {
    Fl_Menu_Item m = *mvalue();
    if (active_r()) m.activate(); else m.deactivate();

    // Clip
    int xx = x() + dx, yy = y() + dy + 1, ww = w() - W, hh = H - 2;
    fl_push_clip(xx, yy, ww, hh);

    if ( Fl::scheme()) {
      Fl_Label l;
      l.value = m.text;
      l.image = 0;
      l.deimage = 0;
      l.type = m.labeltype_;
      l.font = m.labelsize_ || m.labelfont_ ? m.labelfont_ : textfont();
      l.size = m.labelsize_ ? m.labelsize_ : textsize();
      l.color= m.labelcolor_ ? m.labelcolor_ : textcolor();
      if (!m.active()) l.color = fl_inactive((Fl_Color)l.color);
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      l.draw(xx+3, yy, ww>6 ? ww-6 : 0, hh, FL_ALIGN_LEFT);
      fl_draw_shortcut = 0;
      if ( Fl::focus() == this ) draw_focus(box(), xx, yy, ww, hh);
    }
    else {
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      m.draw(xx, yy, ww, hh, this, Fl::focus() == this);
      fl_draw_shortcut = 0;
    }

    fl_pop_clip();
  }

  // Widget's label
  draw_label();
}